

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 HashmapInsertNode(jx9_hashmap *pMap,jx9_hashmap_node *pNode,int bPreserve)

{
  uint uVar1;
  jx9_vm *pjVar2;
  void *pvVar3;
  sxi32 sVar4;
  jx9_value *pValue;
  
  uVar1 = pNode->nValIdx;
  pjVar2 = pNode->pMap->pVm;
  if ((uVar1 < (pjVar2->aMemObj).nUsed) && (pvVar3 = (pjVar2->aMemObj).pBase, pvVar3 != (void *)0x0)
     ) {
    pValue = (jx9_value *)((long)pvVar3 + (ulong)(uVar1 * (pjVar2->aMemObj).eSize));
    if (pNode->iType == 1) {
      sVar4 = HashmapInsertIntKey(pMap,(pNode->xKey).iKey,pValue);
      return sVar4;
    }
    sVar4 = HashmapInsertBlobKey(pMap,(pNode->xKey).sKey.pBlob,(pNode->xKey).sKey.nByte,pValue);
    return sVar4;
  }
  return uVar1;
}

Assistant:

static sxi32 HashmapInsertNode(jx9_hashmap *pMap, jx9_hashmap_node *pNode, int bPreserve)
{
	jx9_value *pObj;
	sxi32 rc;
	/* Extract the node value */
	pObj = HashmapExtractNodeValue(&(*pNode));
	if( pObj == 0 ){
		return SXERR_EMPTY;
	}
	/* Preserve key */
	if( pNode->iType == HASHMAP_INT_NODE){
		/* Int64 key */
		if( !bPreserve ){
			/* Assign an automatic index */
			rc = HashmapInsert(&(*pMap), 0, pObj);
		}else{
			rc = HashmapInsertIntKey(&(*pMap), pNode->xKey.iKey, pObj);
		}
	}else{
		/* Blob key */
		rc = HashmapInsertBlobKey(&(*pMap), SyBlobData(&pNode->xKey.sKey), 
			SyBlobLength(&pNode->xKey.sKey), pObj);
	}
	return rc;
}